

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void us_listen_socket_close(int ssl,us_listen_socket_t *ls)

{
  us_socket_context_t *puVar1;
  us_loop_t *puVar2;
  int iVar3;
  
  iVar3 = us_socket_is_closed(0,&ls->s);
  if (iVar3 == 0) {
    us_internal_socket_context_unlink((ls->s).context,&ls->s);
    us_poll_stop((us_poll_t *)ls,((ls->s).context)->loop);
    iVar3 = us_poll_fd((us_poll_t *)ls);
    close(iVar3);
    puVar1 = (ls->s).context;
    puVar2 = puVar1->loop;
    (ls->s).next = (puVar2->data).closed_head;
    (puVar2->data).closed_head = &ls->s;
    (ls->s).prev = (us_socket_t *)puVar1;
  }
  return;
}

Assistant:

void us_listen_socket_close(int ssl, struct us_listen_socket_t *ls) {
    /* us_listen_socket_t extends us_socket_t so we close in similar ways */
    if (!us_socket_is_closed(0, &ls->s)) {
        us_internal_socket_context_unlink(ls->s.context, &ls->s);
        us_poll_stop((struct us_poll_t *) &ls->s, ls->s.context->loop);
        bsd_close_socket(us_poll_fd((struct us_poll_t *) &ls->s));

        /* Link this socket to the close-list and let it be deleted after this iteration */
        ls->s.next = ls->s.context->loop->data.closed_head;
        ls->s.context->loop->data.closed_head = &ls->s;

        /* Any socket with prev = context is marked as closed */
        ls->s.prev = (struct us_socket_t *) ls->s.context;
    }

    /* We cannot immediately free a listen socket as we can be inside an accept loop */
}